

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O2

void boxsum(int32_t *src,int width,int height,int src_stride,int r,int sqr,int32_t *dst,
           int dst_stride)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int *piVar18;
  int *piVar19;
  int *piVar20;
  int *piVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  int32_t *piVar26;
  int iVar27;
  long lVar28;
  
  if (r == 2) {
    uVar3 = 0;
    if (0 < width) {
      uVar3 = width;
    }
    lVar8 = (long)src_stride;
    lVar14 = (long)dst_stride;
    if (sqr == 0) {
      piVar21 = src + lVar8 * 5;
      piVar19 = dst + lVar14 * 2;
      for (uVar13 = 0; uVar13 != uVar3; uVar13 = uVar13 + 1) {
        iVar15 = src[uVar13];
        iVar12 = src[lVar8 + uVar13];
        iVar27 = src[(long)(src_stride * 2) + uVar13];
        iVar24 = src[(long)(src_stride * 3) + uVar13];
        iVar17 = src[(long)(src_stride * 4) + uVar13];
        iVar4 = iVar12 + iVar15 + iVar27;
        piVar1 = dst + uVar13;
        *piVar1 = iVar4;
        dst[lVar14 + uVar13] = iVar4 + iVar24;
        piVar18 = piVar19;
        piVar20 = piVar21;
        iVar4 = dst_stride * 2;
        iVar25 = dst_stride * 3;
        iVar7 = dst_stride * 4;
        for (lVar9 = 2; lVar9 < height + -3; lVar9 = lVar9 + 1) {
          *piVar18 = iVar15 + iVar27 + iVar17 + iVar12 + iVar24;
          iVar2 = *piVar20;
          iVar7 = iVar7 + dst_stride;
          iVar25 = iVar25 + dst_stride;
          iVar4 = iVar4 + dst_stride;
          piVar20 = piVar20 + lVar8;
          piVar18 = piVar18 + lVar14;
          iVar15 = iVar12;
          iVar12 = iVar27;
          iVar27 = iVar24;
          iVar24 = iVar17;
          iVar17 = iVar2;
        }
        iVar17 = iVar24 + iVar27 + iVar17;
        piVar1[iVar4] = iVar15 + iVar12 + iVar17;
        piVar1[iVar25] = iVar12 + iVar17;
        piVar1[iVar7] = iVar17;
        piVar21 = piVar21 + 1;
        piVar19 = piVar19 + 1;
      }
    }
    else {
      piVar21 = src + lVar8 * 5;
      piVar19 = dst + lVar14 * 2;
      for (uVar13 = 0; uVar13 != uVar3; uVar13 = uVar13 + 1) {
        iVar12 = src[uVar13] * src[uVar13];
        iVar27 = src[lVar8 + uVar13] * src[lVar8 + uVar13];
        iVar24 = src[(long)(src_stride * 2) + uVar13] * src[(long)(src_stride * 2) + uVar13];
        iVar17 = src[(long)(src_stride * 3) + uVar13] * src[(long)(src_stride * 3) + uVar13];
        iVar15 = src[(long)(src_stride * 4) + uVar13];
        iVar4 = iVar27 + iVar12 + iVar24;
        piVar1 = dst + uVar13;
        *piVar1 = iVar4;
        dst[lVar14 + uVar13] = iVar4 + iVar17;
        piVar18 = piVar19;
        piVar20 = piVar21;
        iVar15 = iVar15 * iVar15;
        iVar4 = dst_stride * 2;
        iVar25 = dst_stride * 3;
        iVar7 = dst_stride * 4;
        for (lVar9 = 2; lVar9 < height + -3; lVar9 = lVar9 + 1) {
          *piVar18 = iVar12 + iVar24 + iVar15 + iVar27 + iVar17;
          iVar2 = *piVar20;
          iVar7 = iVar7 + dst_stride;
          iVar25 = iVar25 + dst_stride;
          iVar4 = iVar4 + dst_stride;
          piVar20 = piVar20 + lVar8;
          piVar18 = piVar18 + lVar14;
          iVar12 = iVar27;
          iVar27 = iVar24;
          iVar24 = iVar17;
          iVar17 = iVar15;
          iVar15 = iVar2 * iVar2;
        }
        iVar15 = iVar17 + iVar24 + iVar15;
        piVar1[iVar4] = iVar12 + iVar27 + iVar15;
        piVar1[iVar25] = iVar27 + iVar15;
        piVar1[iVar7] = iVar15;
        piVar21 = piVar21 + 1;
        piVar19 = piVar19 + 1;
      }
    }
    lVar8 = 0x300000000;
    uVar16 = 0;
    uVar13 = (ulong)(uint)height;
    if (height < 1) {
      uVar13 = uVar16;
    }
    lVar9 = lVar14 << 0x20;
    lVar28 = 0x400000000;
    lVar11 = 0x500000000;
    piVar26 = dst;
    for (; uVar16 != uVar13; uVar16 = uVar16 + 1) {
      lVar5 = uVar16 * lVar14;
      iVar15 = dst[lVar5];
      iVar12 = dst[lVar5 + 1];
      iVar27 = iVar12 + iVar15 + dst[lVar5 + 2];
      dst[lVar5] = iVar27;
      dst[lVar5 + 1] = iVar27 + dst[lVar5 + 3];
      lVar10 = lVar11;
      lVar22 = lVar28;
      lVar23 = lVar8;
      iVar27 = dst[lVar5 + 2];
      iVar24 = dst[lVar5 + 3];
      iVar17 = dst[lVar5 + 4];
      for (lVar6 = 2; lVar6 < width + -3; lVar6 = lVar6 + 1) {
        piVar26[lVar6] = iVar15 + iVar27 + iVar17 + iVar12 + iVar24;
        lVar5 = lVar10 >> 0x1e;
        lVar22 = lVar22 + 0x100000000;
        lVar23 = lVar23 + 0x100000000;
        lVar10 = lVar10 + 0x100000000;
        iVar15 = iVar12;
        iVar12 = iVar27;
        iVar27 = iVar24;
        iVar24 = iVar17;
        iVar17 = *(int *)((long)dst + lVar5);
      }
      iVar17 = iVar24 + iVar27 + iVar17;
      piVar26[lVar6] = iVar15 + iVar12 + iVar17;
      *(int *)((long)dst + (lVar23 >> 0x1e)) = iVar12 + iVar17;
      *(int *)((long)dst + (lVar22 >> 0x1e)) = iVar17;
      lVar28 = lVar28 + lVar9;
      lVar8 = lVar8 + lVar9;
      piVar26 = piVar26 + lVar14;
      lVar11 = lVar11 + lVar9;
    }
  }
  else if (r == 1) {
    uVar13 = 0;
    if (0 < width) {
      uVar13 = (ulong)(uint)width;
    }
    lVar14 = (long)src_stride;
    lVar8 = (long)dst_stride;
    if (sqr == 0) {
      piVar21 = src + lVar14 * 3;
      piVar19 = dst + lVar8;
      for (uVar16 = 0; uVar16 != uVar13; uVar16 = uVar16 + 1) {
        iVar15 = src[uVar16];
        iVar12 = src[lVar14 + uVar16];
        iVar27 = src[(long)(src_stride * 2) + uVar16];
        piVar1 = dst + uVar16;
        *piVar1 = iVar12 + iVar15;
        piVar18 = piVar21;
        piVar20 = piVar19;
        iVar24 = dst_stride;
        iVar17 = dst_stride * 2;
        for (lVar9 = 1; lVar9 < height + -2; lVar9 = lVar9 + 1) {
          *piVar20 = iVar15 + iVar27 + iVar12;
          iVar4 = *piVar18;
          iVar17 = iVar17 + dst_stride;
          iVar24 = iVar24 + dst_stride;
          piVar18 = piVar18 + lVar14;
          piVar20 = piVar20 + lVar8;
          iVar15 = iVar12;
          iVar12 = iVar27;
          iVar27 = iVar4;
        }
        piVar1[iVar24] = iVar15 + iVar27 + iVar12;
        piVar1[iVar17] = iVar27 + iVar12;
        piVar21 = piVar21 + 1;
        piVar19 = piVar19 + 1;
      }
    }
    else {
      piVar21 = src + lVar14 * 3;
      piVar19 = dst + lVar8;
      for (uVar16 = 0; uVar16 != uVar13; uVar16 = uVar16 + 1) {
        iVar12 = src[uVar16] * src[uVar16];
        iVar27 = src[lVar14 + uVar16] * src[lVar14 + uVar16];
        iVar15 = src[(long)(src_stride * 2) + uVar16];
        piVar1 = dst + uVar16;
        *piVar1 = iVar27 + iVar12;
        piVar18 = piVar21;
        piVar20 = piVar19;
        iVar15 = iVar15 * iVar15;
        iVar24 = dst_stride;
        iVar17 = dst_stride * 2;
        for (lVar9 = 1; lVar9 < height + -2; lVar9 = lVar9 + 1) {
          *piVar20 = iVar12 + iVar15 + iVar27;
          iVar4 = *piVar18;
          iVar17 = iVar17 + dst_stride;
          iVar24 = iVar24 + dst_stride;
          piVar18 = piVar18 + lVar14;
          piVar20 = piVar20 + lVar8;
          iVar12 = iVar27;
          iVar27 = iVar15;
          iVar15 = iVar4 * iVar4;
        }
        piVar1[iVar24] = iVar12 + iVar15 + iVar27;
        piVar1[iVar17] = iVar15 + iVar27;
        piVar21 = piVar21 + 1;
        piVar19 = piVar19 + 1;
      }
    }
    lVar14 = 0x300000000;
    uVar16 = 0;
    uVar13 = (ulong)(uint)height;
    if (height < 1) {
      uVar13 = uVar16;
    }
    lVar9 = 0x200000000;
    piVar26 = dst;
    for (; uVar16 != uVar13; uVar16 = uVar16 + 1) {
      lVar10 = uVar16 * lVar8;
      iVar15 = dst[lVar10];
      dst[lVar10] = dst[lVar10 + 1] + iVar15;
      lVar22 = 1;
      lVar11 = lVar9;
      lVar28 = lVar14;
      iVar12 = dst[lVar10 + 1];
      iVar27 = dst[lVar10 + 2];
      while( true ) {
        iVar15 = iVar15 + iVar27 + iVar12;
        if (width + -2 <= lVar22) break;
        piVar26[lVar22] = iVar15;
        lVar10 = lVar28 >> 0x1e;
        lVar22 = lVar22 + 1;
        lVar11 = lVar11 + 0x100000000;
        lVar28 = lVar28 + 0x100000000;
        iVar15 = iVar12;
        iVar12 = iVar27;
        iVar27 = *(int *)((long)dst + lVar10);
      }
      piVar26[lVar22] = iVar15;
      *(int *)((long)dst + (lVar11 >> 0x1e)) = iVar27 + iVar12;
      lVar9 = lVar9 + (lVar8 << 0x20);
      piVar26 = piVar26 + lVar8;
      lVar14 = lVar14 + (lVar8 << 0x20);
    }
  }
  return;
}

Assistant:

static void boxsum(int32_t *src, int width, int height, int src_stride, int r,
                   int sqr, int32_t *dst, int dst_stride) {
  if (r == 1)
    boxsum1(src, width, height, src_stride, sqr, dst, dst_stride);
  else if (r == 2)
    boxsum2(src, width, height, src_stride, sqr, dst, dst_stride);
  else
    assert(0 && "Invalid value of r in self-guided filter");
}